

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

uint64_t fmt::v9::detail::dragonbox::umul128_upper64(uint64_t x,uint64_t y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint128_opt p;
  uint64_t y_local;
  uint64_t x_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = x;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = y;
  p._8_8_ = SUB168(auVar1 * auVar2,8);
  return p._8_8_;
}

Assistant:

inline uint64_t umul128_upper64(uint64_t x, uint64_t y) noexcept {
#if FMT_USE_INT128
  auto p = static_cast<uint128_opt>(x) * static_cast<uint128_opt>(y);
  return static_cast<uint64_t>(p >> 64);
#elif defined(_MSC_VER) && defined(_M_X64)
  return __umulh(x, y);
#else
  return umul128(x, y).high();
#endif
}